

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  double dVar1;
  size_t sVar2;
  vec2i vVar3;
  long lVar4;
  vec<3UL,_double> *pvVar5;
  size_t j;
  size_t sVar6;
  long lVar7;
  vec<3UL,_double> ret_1;
  vec<3UL,_double> ret;
  vec2i screen_coords [3];
  vec3f world_coords [3];
  vec3f local_f8;
  double local_d8 [4];
  double local_b8 [3];
  TGAImage *local_a0;
  vec2i local_98 [4];
  vec<3UL,_double> local_78;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_a0 = image;
  sVar2 = Model::nfaces(model);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      local_98[0].x = 0;
      local_98[0].y = 0;
      local_98[1].x = 0;
      local_98[1].y = 0;
      local_98[2].x = 0;
      local_98[2].y = 0;
      local_38 = 0.0;
      local_48 = 0.0;
      dStack_40 = 0.0;
      local_58 = 0.0;
      dStack_50 = 0.0;
      local_78.z = 0.0;
      dStack_60 = 0.0;
      local_78.x = 0.0;
      local_78.y = 0.0;
      sVar6 = 0;
      pvVar5 = &local_78;
      do {
        Model::vert(&local_f8,model,sVar2,sVar6);
        vVar3.x = (int)((local_f8.x + 1.0) * 1200.0 * 0.5);
        vVar3.y = (int)((local_f8.y + 1.0) * 1200.0 * 0.5);
        local_98[sVar6] = vVar3;
        pvVar5->z = local_f8.z;
        pvVar5->x = local_f8.x;
        pvVar5->y = local_f8.y;
        sVar6 = sVar6 + 1;
        pvVar5 = pvVar5 + 1;
      } while (sVar6 != 3);
      local_b8[2] = local_38;
      local_b8[0] = local_48;
      local_b8[1] = dStack_40;
      lVar7 = 3;
      do {
        dVar1 = vec<3UL,_double>::operator[](&local_78,lVar7 - 1);
        lVar4 = 0;
        if (lVar7 != 1) {
          lVar4 = (ulong)(lVar7 != 2) * 8 + 8;
        }
        *(double *)((long)local_b8 + lVar4) = *(double *)((long)local_b8 + lVar4) - dVar1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      local_d8[2] = dStack_50;
      local_d8[0] = dStack_60;
      local_d8[1] = local_58;
      lVar7 = 3;
      do {
        dVar1 = vec<3UL,_double>::operator[](&local_78,lVar7 - 1);
        lVar4 = 0;
        if (lVar7 != 1) {
          lVar4 = (ulong)(lVar7 != 2) * 8 + 8;
        }
        *(double *)((long)local_d8 + lVar4) = *(double *)((long)local_d8 + lVar4) - dVar1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      local_f8.x = local_d8[2] * local_b8[1] - local_b8[2] * local_d8[1];
      local_f8.y = local_d8[0] * local_b8[2] - local_b8[0] * local_d8[2];
      local_f8.z = local_b8[0] * local_d8[1] - local_d8[0] * local_b8[1];
      vec<3UL,_double>::normalize(&local_f8);
      dVar1 = dot<3ul,double>(&local_f8,&light_dir);
      if (0.0 < dVar1) {
        triangle(local_98,local_a0,
                 (TGAColor)((uint5)((int)(dVar1 * 255.0) & 0xff) * 0x10101 | 0x4ff000000));
      }
      sVar2 = sVar2 + 1;
      sVar6 = Model::nfaces(model);
    } while (sVar2 < sVar6);
  }
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    for (size_t i = 0; i < model.nfaces(); i++) {
        vec2i screen_coords[3];
        vec3f world_coords[3];
        for (size_t j = 0; j < 3; j++) {
            vec3f v = model.vert(i, j);
            screen_coords[j] = vec2i(int((v.x + 1.) * width / 2.), int((v.y + 1.) * height / 2.));
            world_coords[j] = v;
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}